

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCACore.cpp
# Opt level: O3

Var __thiscall Js::SCACore::Deserializer::ReadValue(Deserializer *this)

{
  ScriptContext *scriptContext;
  Var pvVar1;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_78 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  
  scriptContext = (this->m_streamReader).super_ScriptContextHolder.m_scriptContext;
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_78,unaff_retaddr,&stack0x00000000,true,false,false);
  ScriptContext::OnScriptStart(scriptContext,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&__entryExitRecord.handledExceptionType)
  ;
  pvVar1 = SCADeserializationEngine::Deserialize
                     (&this->m_streamReader,this->m_transferableVars,this->m_cTransferableVars);
  EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  return pvVar1;
}

Assistant:

Var Deserializer::ReadValue()
        {
            Var returnedValue = nullptr;
            ScriptContext *scriptContext = m_streamReader.GetScriptContext();
            BEGIN_JS_RUNTIME_CALL(scriptContext)
            {
                returnedValue = Js::SCADeserializationEngine::Deserialize(&m_streamReader, m_transferableVars, m_cTransferableVars);
            }
            END_JS_RUNTIME_CALL(scriptContext)
                return returnedValue;
        }